

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O3

void encrypt_cpa(uint8_t *out,public_key *pub,uint8_t *message,uint8_t *randomness)

{
  undefined1 auVar1 [12];
  unkbyte10 Var2;
  uint uVar3;
  uint16_t uVar4;
  short *psVar5;
  ulong uVar6;
  byte bVar7;
  int i;
  long lVar8;
  long lVar9;
  scalar *out_00;
  scalar *psVar10;
  int j;
  long lVar11;
  uint8_t *out_01;
  bool bVar12;
  uint uVar13;
  short sVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint8_t input [33];
  scalar v;
  scalar expanded_message;
  vector u;
  scalar scalar_error;
  vector secret;
  vector error;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined1 local_1848;
  scalar local_1838;
  short local_1638 [256];
  vector local_1438;
  scalar local_e38;
  vector local_c38;
  vector local_638;
  undefined1 auVar14 [12];
  
  local_638.v[0].c._0_8_ = *(undefined8 *)randomness;
  local_638.v[0].c._8_8_ = *(undefined8 *)(randomness + 8);
  local_638.v[0].c._16_8_ = *(undefined8 *)(randomness + 0x10);
  local_638.v[0].c._24_8_ = *(undefined8 *)(randomness + 0x18);
  out_00 = local_638.v;
  psVar10 = local_c38.v;
  lVar8 = 0;
  do {
    lVar11 = lVar8 + 1;
    local_638.v[0].c[0x10]._0_1_ = (undefined1)lVar8;
    scalar_centered_binomial_distribution_eta_2_with_prf(psVar10,(uint8_t *)out_00);
    psVar10 = psVar10 + 1;
    lVar8 = lVar11;
  } while (lVar11 != 3);
  vector_ntt(&local_c38);
  local_1438.v[0].c._0_8_ = *(undefined8 *)randomness;
  local_1438.v[0].c._8_8_ = *(undefined8 *)(randomness + 8);
  local_1438.v[0].c._16_8_ = *(undefined8 *)(randomness + 0x10);
  local_1438.v[0].c._24_8_ = *(undefined8 *)(randomness + 0x18);
  psVar10 = local_1438.v;
  lVar8 = -3;
  do {
    local_1438.v[0].c[0x10]._0_1_ = (char)lVar8 + '\x06';
    scalar_centered_binomial_distribution_eta_2_with_prf(out_00,(uint8_t *)psVar10);
    out_00 = out_00 + 1;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0);
  local_1868 = *(undefined8 *)randomness;
  uStack_1860 = *(undefined8 *)(randomness + 8);
  local_1858 = *(undefined8 *)(randomness + 0x10);
  uStack_1850 = *(undefined8 *)(randomness + 0x18);
  local_1848 = 6;
  scalar_centered_binomial_distribution_eta_2_with_prf(&local_e38,(uint8_t *)&local_1868);
  lVar8 = 0;
  memset(psVar10,0,0x600);
  do {
    lVar11 = 0;
    do {
      scalar_mult(&local_1838,(pub->m).v[lVar8] + lVar11,local_c38.v + lVar11);
      lVar9 = 0;
      do {
        uVar4 = reduce_once(local_1838.c[lVar9] + ((scalar *)psVar10->c)->c[lVar9]);
        ((scalar *)psVar10->c)->c[lVar9] = uVar4;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x100);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar8 = lVar8 + 1;
    psVar10 = psVar10 + 1;
  } while (lVar8 != 3);
  lVar8 = 0;
  do {
    scalar_inverse_ntt((scalar *)((long)local_1438.v[0].c + lVar8));
    lVar8 = lVar8 + 0x200;
  } while (lVar8 != 0x600);
  vector_add(&local_1438,&local_638);
  scalar_inner_product(&local_1838,&pub->t,&local_c38);
  scalar_inverse_ntt(&local_1838);
  lVar8 = 0;
  do {
    uVar4 = reduce_once(local_e38.c[lVar8] + local_1838.c[lVar8]);
    local_1838.c[lVar8] = uVar4;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x100);
  psVar5 = local_1638;
  uVar6 = 0;
  do {
    bVar7 = *message;
    lVar8 = 0;
    do {
      psVar5[lVar8] = (ushort)(bVar7 & 1);
      bVar7 = bVar7 >> 1;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    message = message + 1;
    psVar5 = psVar5 + 8;
    bVar12 = uVar6 < 0xf8;
    uVar6 = uVar6 + 8;
  } while (bVar12);
  lVar8 = 0;
  do {
    auVar19 = *(undefined1 (*) [16])(local_1638 + lVar8);
    auVar16 = pmulhuw(auVar19,_DAT_0023a190);
    sVar15 = auVar19._6_2_ * DAT_0023a190._6_2_;
    uVar3 = CONCAT22(auVar16._6_2_,sVar15);
    Var2 = CONCAT64(CONCAT42(uVar3,auVar16._4_2_),
                    CONCAT22(auVar19._4_2_ * DAT_0023a190._4_2_,sVar15));
    auVar1._4_8_ = (long)((unkuint10)Var2 >> 0x10);
    auVar1._2_2_ = auVar16._2_2_;
    auVar1._0_2_ = auVar19._2_2_ * DAT_0023a190._2_2_;
    auVar18._0_4_ = CONCAT22(auVar16._0_2_,auVar19._0_2_ * (short)DAT_0023a190);
    auVar18._4_12_ = auVar1;
    uVar13 = CONCAT22(auVar16._8_2_,auVar19._8_2_ * DAT_0023a190._8_2_);
    auVar14._0_8_ = CONCAT26(auVar16._10_2_,CONCAT24(auVar19._10_2_ * DAT_0023a190._10_2_,uVar13));
    auVar14._8_2_ = auVar19._12_2_ * DAT_0023a190._12_2_;
    auVar14._10_2_ = auVar16._12_2_;
    auVar19._12_2_ = auVar19._14_2_ * DAT_0023a190._14_2_;
    auVar19._0_12_ = auVar14;
    auVar19._14_2_ = auVar16._14_2_;
    auVar17 = auVar19 & _DAT_0023a1a0;
    auVar20 = auVar18 & _DAT_0023a1a0;
    auVar16._0_4_ = (int)(((uVar13 >> 1) + auVar17._0_4_) * 0x10000) >> 0x10;
    auVar16._4_4_ = (int)(((uint)((ulong)auVar14._0_8_ >> 0x21) + auVar17._4_4_) * 0x10000) >> 0x10;
    auVar16._8_4_ = (int)(((auVar14._8_4_ >> 1) + auVar17._8_4_) * 0x10000) >> 0x10;
    auVar16._12_4_ = (int)(((auVar19._12_4_ >> 1) + auVar17._12_4_) * 0x10000) >> 0x10;
    auVar17._0_4_ = (int)(((auVar18._0_4_ >> 1) + auVar20._0_4_) * 0x10000) >> 0x10;
    auVar17._4_4_ = (int)(((auVar1._0_4_ >> 1) + auVar20._4_4_) * 0x10000) >> 0x10;
    auVar17._8_4_ =
         (int)((((uint)((unkuint10)Var2 >> 0x10) >> 1) + auVar20._8_4_) * 0x10000) >> 0x10;
    auVar17._12_4_ = (int)(((uVar3 >> 1) + auVar20._12_4_) * 0x10000) >> 0x10;
    auVar19 = packssdw(auVar17,auVar16);
    *(undefined1 (*) [16])(local_1638 + lVar8) = auVar19;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x100);
  lVar8 = 0;
  do {
    uVar4 = reduce_once(local_1638[lVar8] + local_1838.c[lVar8]);
    local_1838.c[lVar8] = uVar4;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x100);
  lVar8 = 0;
  do {
    scalar_compress((scalar *)((long)local_1438.v[0].c + lVar8),10);
    lVar8 = lVar8 + 0x200;
  } while (lVar8 != 0x600);
  lVar8 = 0;
  out_01 = out;
  do {
    scalar_encode(out_01,(scalar *)((long)local_1438.v[0].c + lVar8),10);
    out_01 = out_01 + 0x140;
    lVar8 = lVar8 + 0x200;
  } while (lVar8 != 0x600);
  scalar_compress(&local_1838,4);
  scalar_encode(out + 0x3c0,&local_1838,4);
  return;
}

Assistant:

static void encrypt_cpa(uint8_t out[KYBER_CIPHERTEXT_BYTES],
                        const struct public_key *pub, const uint8_t message[32],
                        const uint8_t randomness[32]) {
  uint8_t counter = 0;
  vector secret;
  vector_generate_secret_eta_2(&secret, &counter, randomness);
  vector_ntt(&secret);
  vector error;
  vector_generate_secret_eta_2(&error, &counter, randomness);
  uint8_t input[33];
  OPENSSL_memcpy(input, randomness, 32);
  input[32] = counter;
  scalar scalar_error;
  scalar_centered_binomial_distribution_eta_2_with_prf(&scalar_error, input);
  vector u;
  matrix_mult(&u, &pub->m, &secret);
  vector_inverse_ntt(&u);
  vector_add(&u, &error);
  scalar v;
  scalar_inner_product(&v, &pub->t, &secret);
  scalar_inverse_ntt(&v);
  scalar_add(&v, &scalar_error);
  scalar expanded_message;
  scalar_decode_1(&expanded_message, message);
  scalar_decompress(&expanded_message, 1);
  scalar_add(&v, &expanded_message);
  vector_compress(&u, kDU);
  vector_encode(out, &u, kDU);
  scalar_compress(&v, kDV);
  scalar_encode(out + kCompressedVectorSize, &v, kDV);
}